

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::InlinedVector<int,_4UL,_std::allocator<int>_>::GrowAndEmplaceBack<int>
          (InlinedVector<int,_4UL,_std::allocator<int>_> *this,int *args)

{
  Allocation new_allocation_00;
  size_type sVar1;
  size_type sVar2;
  allocator_type *a;
  pointer piVar3;
  reference piVar4;
  move_iterator<int_*> src;
  move_iterator<int_*> src_last;
  reference new_element;
  Allocation new_allocation;
  size_type s;
  int *args_local;
  InlinedVector<int,_4UL,_std::allocator<int>_> *this_local;
  
  sVar1 = size(this);
  sVar2 = capacity(this);
  if (sVar1 == sVar2) {
    new_allocation.buffer_ = (pointer)size(this);
    a = allocator(this);
    sVar1 = capacity(this);
    Allocation::Allocation((Allocation *)&new_element,a,sVar1 << 1);
    piVar3 = Allocation::buffer((Allocation *)&new_element);
    piVar4 = Construct<int>(this,piVar3 + (long)new_allocation.buffer_,args);
    piVar3 = data(this);
    src = std::make_move_iterator<int*>(piVar3);
    piVar3 = data(this);
    src_last = std::make_move_iterator<int*>(piVar3 + (long)new_allocation.buffer_);
    piVar3 = Allocation::buffer((Allocation *)&new_element);
    InlinedVector<int,4ul,std::allocator<int>>::UninitializedCopy<std::move_iterator<int*>>
              ((InlinedVector<int,4ul,std::allocator<int>> *)this,src,src_last,piVar3);
    new_allocation_00.buffer_ = (pointer)new_allocation.capacity_;
    new_allocation_00.capacity_ = (size_type)new_element;
    ResetAllocation(this,new_allocation_00,(long)new_allocation.buffer_ + 1);
    return piVar4;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<int, 4>::GrowAndEmplaceBack(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <int>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }